

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_6.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_20;
  int local_1c;
  int k;
  int j;
  int i;
  int m;
  int n;
  
  m = 0;
  std::istream::operator>>((istream *)&std::cin,&i);
  for (k = 0; k < i; k = k + 1) {
    std::istream::operator>>((istream *)&std::cin,num + k);
  }
  std::sort<int*>(num,num + i);
  j = 0;
  for (local_1c = 0; local_1c < i; local_1c = local_1c + 1) {
    if ((local_1c != 0) && (num[local_1c] != num[local_1c + -1])) {
      ans[j] = num[local_1c + -1];
      j = j + 1;
    }
  }
  ans[j] = num[i + -1];
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j + 1);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; local_20 < j + 1; local_20 = local_20 + 1) {
    if (local_20 == j) {
      std::ostream::operator<<((ostream *)&std::cout,ans[local_20]);
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ans[local_20]);
      std::operator<<(poVar1," ");
    }
  }
  return 0;
}

Assistant:

int main()
{
    int n,m;
    cin >> n;
    for (int i = 0; i < n; ++i) {
        cin  >> num[i];
    }
    sort(num,num + n);
    m = 0;
    for (int j = 0; j < n; ++j) {
        if(j != 0 && num[j] != num[j-1] )
        ans[m++] = num[j-1];
    }
    ans[m++]  = num[n-1];
    cout << m <<endl;
    for (int k = 0; k < m; ++k) {
        if(k != m-1)
            cout << ans[k] << " ";
        else
            cout << ans[k];
    }
    return 0;
}